

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleGlobalMode(cmGetPropertyCommand *this)

{
  size_type sVar1;
  cmake *pcVar2;
  char *value;
  allocator local_39;
  string local_38;
  
  sVar1 = (this->Name)._M_string_length;
  if (sVar1 == 0) {
    pcVar2 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    value = cmState::GetGlobalProperty(pcVar2->State,&this->PropertyName);
    StoreResult(this,value);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"given name for GLOBAL scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return sVar1 == 0;
}

Assistant:

bool cmGetPropertyCommand::HandleGlobalMode()
{
  if(!this->Name.empty())
    {
    this->SetError("given name for GLOBAL scope.");
    return false;
    }

  // Get the property.
  cmake* cm = this->Makefile->GetCMakeInstance();
  return this->StoreResult(cm->GetState()
             ->GetGlobalProperty(this->PropertyName));
}